

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown2_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  
  do {
    auVar1 = *(undefined1 (*) [16])src_ptr;
    auVar2 = *(undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    uVar5 = auVar1._0_2_ >> 8;
    uVar6 = auVar1._2_2_ >> 8;
    uVar7 = auVar1._4_2_ >> 8;
    uVar8 = auVar1._6_2_ >> 8;
    uVar9 = auVar1._8_2_ >> 8;
    uVar10 = auVar1._10_2_ >> 8;
    uVar11 = auVar1._12_2_ >> 8;
    uVar12 = auVar1._14_2_ >> 8;
    uVar13 = auVar2._0_2_ >> 8;
    uVar14 = auVar2._2_2_ >> 8;
    uVar15 = auVar2._4_2_ >> 8;
    uVar16 = auVar2._6_2_ >> 8;
    uVar17 = auVar2._8_2_ >> 8;
    uVar18 = auVar2._10_2_ >> 8;
    uVar19 = auVar2._12_2_ >> 8;
    uVar20 = auVar2._14_2_ >> 8;
    *dst_ptr = (uVar5 != 0) * (uVar5 < 0x100) * auVar1[1] - (0xff < uVar5);
    dst_ptr[1] = (uVar6 != 0) * (uVar6 < 0x100) * auVar1[3] - (0xff < uVar6);
    dst_ptr[2] = (uVar7 != 0) * (uVar7 < 0x100) * auVar1[5] - (0xff < uVar7);
    dst_ptr[3] = (uVar8 != 0) * (uVar8 < 0x100) * auVar1[7] - (0xff < uVar8);
    dst_ptr[4] = (uVar9 != 0) * (uVar9 < 0x100) * auVar1[9] - (0xff < uVar9);
    dst_ptr[5] = (uVar10 != 0) * (uVar10 < 0x100) * auVar1[0xb] - (0xff < uVar10);
    dst_ptr[6] = (uVar11 != 0) * (uVar11 < 0x100) * auVar1[0xd] - (0xff < uVar11);
    dst_ptr[7] = (uVar12 != 0) * (uVar12 < 0x100) * auVar1[0xf] - (0xff < uVar12);
    dst_ptr[8] = (uVar13 != 0) * (uVar13 < 0x100) * auVar2[1] - (0xff < uVar13);
    dst_ptr[9] = (uVar14 != 0) * (uVar14 < 0x100) * auVar2[3] - (0xff < uVar14);
    dst_ptr[10] = (uVar15 != 0) * (uVar15 < 0x100) * auVar2[5] - (0xff < uVar15);
    dst_ptr[0xb] = (uVar16 != 0) * (uVar16 < 0x100) * auVar2[7] - (0xff < uVar16);
    dst_ptr[0xc] = (uVar17 != 0) * (uVar17 < 0x100) * auVar2[9] - (0xff < uVar17);
    dst_ptr[0xd] = (uVar18 != 0) * (uVar18 < 0x100) * auVar2[0xb] - (0xff < uVar18);
    dst_ptr[0xe] = (uVar19 != 0) * (uVar19 < 0x100) * auVar2[0xd] - (0xff < uVar19);
    dst_ptr[0xf] = (uVar20 != 0) * (uVar20 < 0x100) * auVar2[0xf] - (0xff < uVar20);
    dst_ptr = dst_ptr + 0x10;
    iVar4 = dst_width + -0x10;
    bVar3 = 0xf < dst_width;
    dst_width = iVar4;
  } while (iVar4 != 0 && bVar3);
  return;
}

Assistant:

void ScaleRowDown2_SSSE3(const uint8_t* src_ptr,
                         ptrdiff_t src_stride,
                         uint8_t* dst_ptr,
                         int dst_width) {
  (void)src_stride;
  asm volatile(
      // 16 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}